

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex.cpp
# Opt level: O2

void __thiscall
ary::AnchoredLocalization::draw(AnchoredLocalization *this,Mat *image,SharedCameraModel *model)

{
  pointer pPVar1;
  long *plVar2;
  long lVar3;
  MatCommaInitializer_<float> *pMVar4;
  MatCommaInitializer_ *this_00;
  _OutputArray *p_Var5;
  ulong uVar6;
  long lVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar8;
  float fVar9;
  Matx<float,_4,_1> MVar10;
  int local_300;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  int local_2f0;
  int local_2ec;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> model2ImagePts;
  MatCommaInitializer_<float> local_2c0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  undefined1 local_278 [24];
  _OutputArray local_260;
  _InputArray local_248;
  _InputArray local_230;
  _InputArray local_218;
  _InputArray local_200;
  Mat local_1e8;
  CameraPosition camera;
  Matx<double,_4,_1> local_158;
  undefined1 local_138 [16];
  uchar *local_128;
  Matx44f offset;
  Mat modelPts;
  
  lVar7 = 0;
  uVar6 = 0;
  while( true ) {
    pPVar1 = (this->localizations).
             super__Vector_base<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->localizations).
                      super__Vector_base<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 4) <= uVar6)
    break;
    plVar2 = *(long **)((long)&(pPVar1->super_shared_ptr<ary::Localization>).
                               super___shared_ptr<ary::Localization,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr + lVar7);
    (**(code **)(*plVar2 + 0x18))(plVar2,image,model);
    model2ImagePts.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    model2ImagePts.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    model2ImagePts.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar3 = *(long *)((long)&(((this->anchors).
                               super__Vector_base<cv::Ptr<ary::SceneAnchor>,_std::allocator<cv::Ptr<ary::SceneAnchor>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_shared_ptr<ary::SceneAnchor>).
                             super___shared_ptr<ary::SceneAnchor,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     + lVar7);
    offset.val._0_8_ = *(undefined8 *)(lVar3 + 0x28);
    offset.val._8_8_ = *(undefined8 *)(lVar3 + 0x30);
    offset.val[4] = *(float *)(lVar3 + 0x38);
    offset.val[5] = *(float *)(lVar3 + 0x3c);
    fVar8 = *(float *)(lVar3 + 0x40);
    fVar9 = *(float *)(lVar3 + 0x44);
    offset.val._32_8_ = *(undefined8 *)(lVar3 + 0x48);
    offset.val._40_8_ = *(undefined8 *)(lVar3 + 0x50);
    offset.val._48_8_ = *(undefined8 *)(lVar3 + 0x58);
    offset.val._56_8_ = *(undefined8 *)(lVar3 + 0x60);
    offset.val[6] = fVar8;
    offset.val[7] = fVar9;
    cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_1e8);
    local_1e8.flags = 0;
    local_1e8.dims = 0;
    local_1e8.rows = 0;
    local_1e8.cols = 0;
    local_1e8.data = (uchar *)0x0;
    local_1e8.datastart = (uchar *)0x3ff0000000000000;
    cv::operator*((Scalar *)&modelPts,&offset,(Scalar *)&local_1e8);
    MVar10 = cv::Matx::operator_cast_to_Matx((Matx *)&modelPts);
    local_278._8_4_ = extraout_XMM0_Dc;
    local_278._0_8_ = MVar10.val._0_8_;
    local_278._12_4_ = extraout_XMM0_Dd;
    local_288._8_4_ = fVar8;
    local_288._0_8_ = MVar10.val._8_8_;
    local_288._12_4_ = fVar9;
    cv::Mat_<float>::Mat_((Mat_<float> *)local_138,3,3);
    cv::MatConstIterator::MatConstIterator((MatConstIterator *)&camera,(Mat *)local_138);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_((MatCommaInitializer_<float> *)&camera,0.01)
    ;
    local_2c0.it.super_MatConstIterator_<float>.super_MatConstIterator.m =
         (pMVar4->it).super_MatConstIterator_<float>.super_MatConstIterator.m;
    local_2c0.it.super_MatConstIterator_<float>.super_MatConstIterator.elemSize =
         (pMVar4->it).super_MatConstIterator_<float>.super_MatConstIterator.elemSize;
    local_2c0.it.super_MatConstIterator_<float>.super_MatConstIterator.ptr =
         (pMVar4->it).super_MatConstIterator_<float>.super_MatConstIterator.ptr;
    local_2c0.it.super_MatConstIterator_<float>.super_MatConstIterator.sliceStart =
         (pMVar4->it).super_MatConstIterator_<float>.super_MatConstIterator.sliceStart;
    local_2c0.it.super_MatConstIterator_<float>.super_MatConstIterator.sliceEnd =
         (pMVar4->it).super_MatConstIterator_<float>.super_MatConstIterator.sliceEnd;
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(&local_2c0,0.01);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(pMVar4,0.01);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(pMVar4,0);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(pMVar4,0);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(pMVar4,0);
    local_298 = (float)local_288._4_4_;
    fStack_294 = (float)local_288._4_4_;
    fStack_290 = (float)local_288._4_4_;
    fStack_28c = (float)local_288._4_4_;
    pMVar4 = cv::MatCommaInitializer_<float>::operator_
                       (pMVar4,(float)local_278._0_4_ / (float)local_288._4_4_);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(pMVar4,(float)local_278._4_4_ / local_298);
    this_00 = (MatCommaInitializer_ *)
              cv::MatCommaInitializer_<float>::operator_(pMVar4,(float)local_288._0_4_ / local_298);
    cv::MatCommaInitializer_::operator_cast_to_Mat_((Mat_<float> *)&local_1e8,this_00);
    cv::Mat::Mat(&modelPts,&local_1e8);
    cv::Mat::~Mat(&local_1e8);
    cv::Mat::~Mat((Mat *)local_138);
    (**(code **)(**(long **)((long)&(((this->localizations).
                                      super__Vector_base<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super_shared_ptr<ary::Localization>).
                                    super___shared_ptr<ary::Localization,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + lVar7) + 0x10))(&camera);
    local_2c0.it.super_MatConstIterator_<float>.super_MatConstIterator.ptr = (uchar *)0x0;
    local_2c0.it.super_MatConstIterator_<float>.super_MatConstIterator.m =
         (Mat *)CONCAT44(local_2c0.it.super_MatConstIterator_<float>.super_MatConstIterator.m._4_4_,
                         0x1010000);
    local_200.flags = -0x3efdfffb;
    local_200.sz.width = 1;
    local_200.sz.height = 3;
    local_218.flags = -0x3efdfffb;
    local_218.obj = &camera.translation;
    local_218.sz.width = 1;
    local_218.sz.height = 3;
    local_2c0.it.super_MatConstIterator_<float>.super_MatConstIterator.elemSize = (size_t)&modelPts;
    local_200.obj = &camera;
    CameraModel::getIntrinsics
              ((model->super_shared_ptr<ary::CameraModel>).
               super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    local_230.flags = -0x3efdfffb;
    local_230.sz.width = 3;
    local_230.sz.height = 3;
    local_230.obj = (Mat *)local_138;
    CameraModel::getDistortion
              (&local_1e8,
               (model->super_shared_ptr<ary::CameraModel>).
               super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    local_248.sz.width = 0;
    local_248.sz.height = 0;
    local_260.super__InputArray.sz.width = 0;
    local_260.super__InputArray.sz.height = 0;
    local_248.flags = 0x1010000;
    local_260.super__InputArray.flags = -0x7dfcfff3;
    local_260.super__InputArray.obj = &model2ImagePts;
    local_248.obj = &local_1e8;
    p_Var5 = (_OutputArray *)cv::noArray();
    cv::projectPoints((_InputArray *)&local_2c0,&local_200,&local_218,&local_230,&local_248,
                      &local_260,p_Var5,0.0);
    cv::Mat::~Mat(&local_1e8);
    local_128 = (uchar *)0x0;
    local_138._0_4_ = 3.7909693e-37;
    local_2f0 = (int)ROUND(model2ImagePts.
                           super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].x);
    local_2ec = (int)ROUND(model2ImagePts.
                           super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].y);
    local_2f8 = (int)ROUND(model2ImagePts.
                           super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[2].x);
    local_2f4 = (int)ROUND(model2ImagePts.
                           super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[2].y);
    local_138._8_8_ = image;
    cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_1e8);
    local_1e8.flags = 0;
    local_1e8.dims = 0x406fe000;
    local_1e8.rows = 0;
    local_1e8.cols = 0x406fe000;
    local_1e8.data = (uchar *)0x0;
    local_1e8.datastart = (uchar *)0x0;
    cv::line((Mat *)local_138,&local_2f0,&local_2f8,&local_1e8,2,8,
             (ulong)p_Var5 & 0xffffffff00000000);
    local_128 = (uchar *)0x0;
    local_138._0_4_ = 3.7909693e-37;
    local_138._8_8_ = image;
    std::__cxx11::string::string
              ((string *)&local_1e8,
               (string *)
               (*(long *)((long)&(((this->anchors).
                                   super__Vector_base<cv::Ptr<ary::SceneAnchor>,_std::allocator<cv::Ptr<ary::SceneAnchor>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_shared_ptr<ary::SceneAnchor>).
                                 super___shared_ptr<ary::SceneAnchor,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + lVar7) + 8));
    local_300 = (int)ROUND((model2ImagePts.
                            super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->x);
    local_2fc = (int)ROUND((model2ImagePts.
                            super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->y);
    cv::Matx<double,_4,_1>::Matx(&local_158);
    local_158.val[0] = 255.0;
    local_158.val[1] = 100.0;
    local_158.val[2] = 255.0;
    local_158.val[3] = 0.0;
    cv::putText(0,(Mat *)local_138,&local_1e8,&local_300,0,&local_158,2,8,0);
    std::__cxx11::string::~string((string *)&local_1e8);
    cv::Mat::~Mat(&modelPts);
    std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
              (&model2ImagePts.
                super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 0x10;
  }
  (*(this->super_Localization)._vptr_Localization[2])((CameraPosition *)local_138,this);
  CameraModel::getIntrinsics
            ((model->super_shared_ptr<ary::CameraModel>).
             super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  CameraModel::getDistortion
            (&modelPts,
             (model->super_shared_ptr<ary::CameraModel>).
             super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  drawSystem(image,(CameraPosition *)local_138,(Matx33f *)&local_1e8,&modelPts,0.1,3);
  cv::Mat::~Mat(&modelPts);
  return;
}

Assistant:

void AnchoredLocalization::draw(Mat& image, SharedCameraModel& model) const {

    for (size_t i = 0; i < localizations.size(); i++) {
        localizations[i]->draw(image, model);

        std::vector<cv::Point2f> model2ImagePts;
        
        Matx44f offset = anchors[i]->getTransform();

        Point3f origin = extract_homogeneous(offset * Scalar(0, 0, 0, 1));

        Mat modelPts = (Mat_<float>(3, 3) <<
                        0.01, 0.01, 0.01,
                        0, 0, 0,
                        origin.x, origin.y, origin.z);

        CameraPosition camera = localizations[i]->getCameraPosition();

        projectPoints(modelPts, camera.rotation, camera.translation, model->getIntrinsics(), model->getDistortion(), model2ImagePts);

        line(image, model2ImagePts[1], model2ImagePts[2], Scalar(255, 255, 0), 2);

        putText(image, anchors[i]->getName(), model2ImagePts[0], FONT_HERSHEY_SIMPLEX, 0.5f, Scalar(255, 100, 255), 2);

    }

    drawSystem(image, getCameraPosition(), model->getIntrinsics(), model->getDistortion());

}